

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O2

void IremGA20_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  UINT8 *pUVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  UINT32 UVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  IremGA20_channel_def *ch;
  ulong uVar8;
  bool bVar9;
  
  pDVar2 = *outputs;
  pDVar3 = outputs[1];
  for (uVar8 = 0; uVar8 != samples; uVar8 = uVar8 + 1) {
    iVar7 = 0;
    lVar5 = 4;
    ch = (IremGA20_channel_def *)((long)param + 0x34);
    while (bVar9 = lVar5 != 0, lVar5 = lVar5 + -1, bVar9) {
      if ((ch->Muted == '\0') && (ch->play != '\0')) {
        if (*(char *)((long)param + 0xa4) == '\0') {
          iVar6 = (uint)ch->volume * (int)ch->smpl1;
          UVar4 = ch->frac;
        }
        else {
          UVar4 = ch->frac;
          iVar6 = (int)((uint)ch->volume *
                       ((int)ch->smpl2 * UVar4 + (0x10000 - UVar4) * (int)ch->smpl1)) >> 0x10;
        }
        iVar7 = iVar6 + iVar7;
        ch->frac = UVar4 + ch->fracrate;
        pUVar1 = &ch->counter;
        *pUVar1 = *pUVar1 + '\x01';
        if (*pUVar1 == '\0') {
          ch->pos = ch->pos + 1;
          ch->frac = 0;
          ch->counter = ch->rate;
          irem_ga20_cache_samples((ga20_state *)param,ch);
        }
      }
      ch = ch + 1;
    }
    pDVar2[uVar8] = iVar7 >> 2;
    pDVar3[uVar8] = iVar7 >> 2;
  }
  return;
}

Assistant:

static void IremGA20_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ga20_state *chip = (ga20_state *)param;
	DEV_SMPL *outL, *outR;
	UINT32 i;
	int j;
	DEV_SMPL smpl_int;
	DEV_SMPL sampleout;
	struct IremGA20_channel_def* ch;

	outL = outputs[0];
	outR = outputs[1];

	for (i = 0; i < samples; i++)
	{
		sampleout = 0;

		for (j = 0; j < 4; j++)
		{
			ch = &chip->channel[j];
			if (ch->Muted || ! ch->play)
				continue;
			
			if (! chip->interpolate)
			{
				sampleout += ch->smpl1 * (INT32)ch->volume;
			}
			else
			{
				smpl_int = (ch->smpl1 * ((1 << RATE_SHIFT) - ch->frac) + ch->smpl2 * ch->frac);
				sampleout += (smpl_int * (INT32)ch->volume) >> RATE_SHIFT;
			}
			ch->frac += ch->fracrate;
			ch->counter ++;
			if (! ch->counter)
			{
				// advance position + reset counter on overflow
				ch->pos ++;
				ch->frac = 0;
				ch->counter = ch->rate;
				irem_ga20_cache_samples(chip, ch);
			}
		}

		sampleout >>= 2;
		outL[i] = sampleout;
		outR[i] = sampleout;
	}
}